

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

int polyroot(double *coeff,int DEGREE,double *ZEROR,double *ZEROI)

{
  int iVar1;
  double *OPR_00;
  double *OPI_00;
  double *OPI;
  double *OPR;
  int local_30;
  int N;
  int i;
  int fail;
  double *ZEROI_local;
  double *ZEROR_local;
  int DEGREE_local;
  double *coeff_local;
  
  iVar1 = DEGREE + 1;
  OPR_00 = (double *)malloc((long)iVar1 << 3);
  OPI_00 = (double *)malloc((long)iVar1 << 3);
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    OPR_00[local_30] = coeff[DEGREE - local_30];
    OPI_00[local_30] = 0.0;
  }
  iVar1 = cpoly(OPR_00,OPI_00,DEGREE,ZEROR,ZEROI);
  free(OPR_00);
  free(OPI_00);
  return iVar1;
}

Assistant:

int polyroot(double *coeff, int DEGREE, double *ZEROR, double *ZEROI) {
	/*
	Input - coeff[0] + coeff[1] * x^1 + coeff[2] * x^2 + ---- + coeff[DEGREE+1] * x^DEGREE 

	The program fails if there are leading zeros. Check return value.

	Return Value = 0 -> Probable Success
	Return Value = 1 -> Likely Failure
	*/
	int fail,i,N;
	double *OPR, *OPI;

	N = DEGREE + 1;
	OPR = (double*)malloc(sizeof(double)* N);
	OPI = (double*)malloc(sizeof(double)* N);

	for (i = 0; i < N; ++i) {
		OPR[i] = coeff[N - 1 - i];
		OPI[i] = 0.0;
	}
	fail = cpoly(OPR, OPI, DEGREE, ZEROR, ZEROI);

	free(OPR);
	free(OPI);
	return fail;
}